

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

char * lookup_superclass_identifier(gvisitor_t *self,gravity_class_t *c)

{
  ulong *puVar1;
  char *local_70;
  long local_68;
  gnode_class_decl_t *local_60;
  gnode_class_decl_t *super;
  gravity_class_t *target;
  gnode_class_decl_t *node;
  size_t i;
  size_t count;
  gnode_class_r *superfix;
  codegen_t *data;
  gravity_class_t *c_local;
  gvisitor_t *self_local;
  
  if (c->superlook == (char *)0x0) {
    puVar1 = (ulong *)((long)self->data + 0x18);
    if (puVar1 == (ulong *)0x0) {
      local_60 = (gnode_class_decl_t *)0x0;
    }
    else {
      local_60 = (gnode_class_decl_t *)*puVar1;
    }
    for (node = (gnode_class_decl_t *)0x0; node < local_60;
        node = (gnode_class_decl_t *)((long)&(node->base).tag + 1)) {
      if (node < (gnode_class_decl_t *)*puVar1) {
        local_68 = *(long *)(*(long *)((long)self->data + 0x28) + (long)node * 8);
      }
      else {
        local_68 = 0;
      }
      if (*(gravity_class_t **)(local_68 + 0x90) == c) {
        if (*(long *)(local_68 + 0x68) == 0) {
          local_70 = (char *)0x0;
        }
        else {
          local_70 = *(char **)(*(long *)(local_68 + 0x68) + 0x60);
        }
        return local_70;
      }
    }
    self_local = (gvisitor_t *)0x0;
  }
  else {
    self_local = (gvisitor_t *)c->superlook;
  }
  return (char *)self_local;
}

Assistant:

static const char *lookup_superclass_identifier (gvisitor_t *self, gravity_class_t *c) {
    if (c->superlook) return c->superlook;
    
    codegen_t       *data = (codegen_t *)self->data;
    gnode_class_r   *superfix = &data->superfix;
    
    size_t count = gnode_array_size(superfix);
    for (size_t i=0; i<count; ++i) {
        gnode_class_decl_t *node = (gnode_class_decl_t *)gnode_array_get(superfix, i);
        gravity_class_t *target = (gravity_class_t *)node->data;
        if (target == c) {
            gnode_class_decl_t *super = (gnode_class_decl_t *)node->superclass;
            return (super) ? super->identifier : NULL;
        }
    }
    
    return NULL;
}